

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_bcons.cc
# Opt level: O0

void * v2i_BASIC_CONSTRAINTS(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *values)

{
  int iVar1;
  CONF_VALUE *pCVar2;
  CONF_VALUE *val;
  size_t i;
  BASIC_CONSTRAINTS *bcons;
  stack_st_CONF_VALUE *values_local;
  X509V3_CTX *ctx_local;
  X509V3_EXT_METHOD *method_local;
  
  method_local = (X509V3_EXT_METHOD *)BASIC_CONSTRAINTS_new();
  if (method_local == (X509V3_EXT_METHOD *)0x0) {
    method_local = (X509V3_EXT_METHOD *)0x0;
  }
  else {
    for (val = (CONF_VALUE *)0x0; pCVar2 = (CONF_VALUE *)sk_CONF_VALUE_num(values), val < pCVar2;
        val = (CONF_VALUE *)((long)&val->section + 1)) {
      pCVar2 = sk_CONF_VALUE_value(values,(size_t)val);
      iVar1 = strcmp(pCVar2->name,"CA");
      if (iVar1 == 0) {
        iVar1 = X509V3_get_value_bool((CONF_VALUE *)pCVar2,(int *)method_local);
      }
      else {
        iVar1 = strcmp(pCVar2->name,"pathlen");
        if (iVar1 != 0) {
          ERR_put_error(0x14,0,0x7b,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_bcons.cc"
                        ,0x56);
          ERR_add_error_data(6,"section:",pCVar2->section,",name:",pCVar2->name,",value:",
                             pCVar2->value);
          goto LAB_004adf35;
        }
        iVar1 = X509V3_get_value_int((CONF_VALUE *)pCVar2,(ASN1_INTEGER **)&method_local->it);
      }
      if (iVar1 == 0) {
LAB_004adf35:
        BASIC_CONSTRAINTS_free((BASIC_CONSTRAINTS *)method_local);
        return (void *)0x0;
      }
    }
  }
  return method_local;
}

Assistant:

static void *v2i_BASIC_CONSTRAINTS(const X509V3_EXT_METHOD *method,
                                   const X509V3_CTX *ctx,
                                   const STACK_OF(CONF_VALUE) *values) {
  BASIC_CONSTRAINTS *bcons = NULL;
  if (!(bcons = BASIC_CONSTRAINTS_new())) {
    return NULL;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(values); i++) {
    const CONF_VALUE *val = sk_CONF_VALUE_value(values, i);
    if (!strcmp(val->name, "CA")) {
      if (!X509V3_get_value_bool(val, &bcons->ca)) {
        goto err;
      }
    } else if (!strcmp(val->name, "pathlen")) {
      if (!X509V3_get_value_int(val, &bcons->pathlen)) {
        goto err;
      }
    } else {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_NAME);
      X509V3_conf_err(val);
      goto err;
    }
  }
  return bcons;
err:
  BASIC_CONSTRAINTS_free(bcons);
  return NULL;
}